

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

void Executor::declareStmt(treeNode *node)

{
  treeNode *node_00;
  string local_30;
  
  node_00 = node->child[1];
  std::__cxx11::string::string((string *)&local_30,(string *)&node->child[0]->text);
  declareSequence(node_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void declareStmt(treeNode* node)
    {
        declareSequence(node->child[1], node->child[0]->text);
    }